

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_jsr_Test::~CpuTest_jsr_Test(CpuTest_jsr_Test *this)

{
  CpuTest_jsr_Test *this_local;
  
  ~CpuTest_jsr_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, jsr) {
    registers.pc = 0x1234;
    stage_instruction(JSR);
    expected.pc = 0xDEAD;
    expected.sp -= 2; // pc (2 bytes)

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, write_byte(kStackOffset + registers.sp, 0x12));
    EXPECT_CALL(mmu, write_byte(kStackOffset + registers.sp - 1u, 0x36));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0xDE));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}